

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[63],unsigned_int&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [63],uint *params_1,
          char (*params_2) [2])

{
  char (*value) [63];
  kj *this_00;
  char (*value_00) [2];
  uint *value_01;
  ArrayPtr<const_char> local_60;
  CappedArray<char,_14UL> local_50;
  ArrayPtr<const_char> local_38;
  char (*local_28) [2];
  char (*params_local_2) [2];
  uint *params_local_1;
  char (*params_local) [63];
  
  local_28 = (char (*) [2])params_1;
  params_local_2 = (char (*) [2])params;
  params_local_1 = (uint *)this;
  params_local = (char (*) [63])__return_storage_ptr__;
  value = ::const((char (*) [63])this);
  local_38 = toCharSequence<char_const(&)[63]>(value);
  this_00 = (kj *)fwd<unsigned_int&>((uint *)params_local_2);
  toCharSequence<unsigned_int&>(&local_50,this_00,value_01);
  value_00 = ::const(local_28);
  local_60 = toCharSequence<char_const(&)[2]>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_50,
             (CappedArray<char,_14UL> *)&local_60,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}